

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegressionTree.cpp
# Opt level: O2

void __thiscall RegressionTree::loadFeatures(RegressionTree *this)

{
  var_bitset *this_00;
  var_bitset *this_01;
  RegressionTree *pRVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  size_t *__s;
  istream *piVar5;
  size_t sVar6;
  size_t sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  int numOfFeatures;
  RegressionTree *local_4e0;
  int local_4d8;
  int degreeOfInteractions;
  string line;
  string rootName;
  string attrName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  string typeOfFeature;
  string typeOfLabel;
  string labelName;
  stringstream ssLine;
  ostream local_3b0 [376];
  ifstream input;
  byte abStack_218 [488];
  
  __s = (size_t *)operator_new__(800);
  memset(__s,0,800);
  this->_queryRootIndex = __s;
  std::ifstream::ifstream(&input,(string *)multifaq::config::FEATURE_CONF_abi_cxx11_,_S_in);
  if ((abStack_218[*(long *)(_input + -0x18)] & 5) == 0) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    std::__cxx11::stringstream::stringstream((stringstream *)&ssLine);
    numOfFeatures = 0;
    degreeOfInteractions = 0;
    do {
      do {
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&input,(string *)&line);
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) goto LAB_00154a9f;
      } while (*line._M_dataplus._M_p == '#');
      bVar2 = std::operator==(&line,"");
    } while (bVar2);
LAB_00154a9f:
    local_470._M_dataplus._M_p = line._M_dataplus._M_p;
    typeOfFeature._M_dataplus._M_p = (pointer)&numOfFeatures;
    attrName._M_string_length = (size_type)&typeOfFeature;
    typeOfLabel._M_dataplus._M_p = (pointer)&attrName;
    attrName._M_dataplus._M_p = &boost::spirit::int_;
    labelName._M_dataplus._M_p = (pointer)&typeOfLabel;
    typeOfLabel._M_string_length = (size_type)&NUMBER_SEPARATOR_CHAR;
    local_450._M_dataplus._M_p = (pointer)&degreeOfInteractions;
    rootName._M_string_length = (size_type)&local_450;
    labelName._M_string_length = (size_type)&rootName;
    rootName._M_dataplus._M_p = &boost::spirit::int_;
    boost::spirit::qi::
    phrase_parse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::int_>const&,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<int>>,0l>>,boost::phoenix::actor<boost::spirit::argument<0>>>,2l>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::int_>const&,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<int>>,0l>>,boost::phoenix::actor<boost::spirit::argument<0>>>,2l>>const&>,2l>const&>,2l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>>
              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_470,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(line._M_dataplus._M_p + line._M_string_length),
               (expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::int_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<int>_>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::int_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<int>_>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_2L>
                *)&labelName,
               (expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>
                *)&boost::spirit::ascii::space,postskip);
    do {
      do {
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&input,(string *)&line);
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) goto LAB_00154b6a;
      } while (*line._M_dataplus._M_p == '#');
      bVar2 = std::operator==(&line,"");
    } while (bVar2);
LAB_00154b6a:
    std::operator<<(local_3b0,(string *)&line);
    labelName._M_dataplus._M_p = (pointer)&labelName.field_2;
    labelName._M_string_length = 0;
    labelName.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&ssLine,(string *)&labelName,':');
    typeOfLabel._M_dataplus._M_p = (pointer)&typeOfLabel.field_2;
    typeOfLabel._M_string_length = 0;
    typeOfLabel.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&ssLine,(string *)&typeOfLabel);
    bVar3 = this->_classification;
    if ((bool)bVar3 == false) {
      iVar4 = std::__cxx11::stoi(&typeOfLabel,(size_t *)0x0,10);
      if (iVar4 != 0) {
        std::operator<<((ostream *)&std::cerr,"The label needs to be continuous! ");
        goto LAB_00154f91;
      }
      bVar3 = this->_classification;
    }
    if ((bVar3 & 1) != 0) {
      iVar4 = std::__cxx11::stoi(&typeOfLabel,(size_t *)0x0,10);
      if (iVar4 != 1) {
        std::operator<<((ostream *)&std::cerr,"The label needs to be categorical! ");
        goto LAB_00154f91;
      }
    }
    sVar6 = TreeDecomposition::getAttributeIndex
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,&labelName);
    this->_labelID = (int)sVar6;
    std::ios::clear((int)*(undefined8 *)(_ssLine + -0x18) + (int)(istream *)&ssLine);
    this_00 = &this->_features;
    this_01 = &this->_categoricalFeatures;
    iVar4 = 1;
    while( true ) {
      do {
        do {
          if (numOfFeatures <= iVar4) {
            std::__cxx11::string::~string((string *)&typeOfLabel);
            std::__cxx11::string::~string((string *)&labelName);
            std::__cxx11::stringstream::~stringstream((stringstream *)&ssLine);
            std::__cxx11::string::~string((string *)&line);
            std::ifstream::~ifstream(&input);
            return;
          }
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&input,(string *)&line);
        } while (*line._M_dataplus._M_p == '#');
        bVar2 = std::operator==(&line,"");
      } while (bVar2);
      local_4e0 = this;
      std::operator<<(local_3b0,(string *)&line);
      attrName._M_dataplus._M_p = (pointer)&attrName.field_2;
      attrName._M_string_length = 0;
      attrName.field_2._M_local_buf[0] = '\0';
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&ssLine,(string *)&attrName,':');
      typeOfFeature._M_dataplus._M_p = (pointer)&typeOfFeature.field_2;
      typeOfFeature._M_string_length = 0;
      typeOfFeature.field_2._M_local_buf[0] = '\0';
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&ssLine,(string *)&typeOfFeature,':');
      rootName._M_dataplus._M_p = (pointer)&rootName.field_2;
      rootName._M_string_length = 0;
      rootName.field_2._M_local_buf[0] = '\0';
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&ssLine,(string *)&rootName);
      pRVar1 = local_4e0;
      sVar6 = TreeDecomposition::getAttributeIndex
                        ((local_4e0->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         &attrName);
      local_4d8 = std::__cxx11::stoi(&typeOfFeature,(size_t *)0x0,10);
      sVar7 = TreeDecomposition::getRelationIndex
                        ((pRVar1->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         &rootName);
      if ((int)sVar6 == -1) break;
      if ((int)sVar7 == -1) {
        std::operator+(&local_470,"Relation |",&rootName);
        std::operator+(&local_450,&local_470,"| does not exist.");
        std::operator<<((ostream *)&std::cerr,(string *)&local_450);
        goto LAB_00154f7a;
      }
      sVar6 = (size_t)(int)sVar6;
      std::bitset<100UL>::set(this_00,sVar6,true);
      if (local_4d8 != 0) {
        std::bitset<100UL>::set(this_01,sVar6,true);
      }
      local_4e0->_queryRootIndex[sVar6] = (long)(int)sVar7;
      std::ios::clear((int)*(undefined8 *)(_ssLine + -0x18) + (int)&ssLine);
      std::__cxx11::string::~string((string *)&rootName);
      std::__cxx11::string::~string((string *)&typeOfFeature);
      std::__cxx11::string::~string((string *)&attrName);
      iVar4 = iVar4 + 1;
      this = local_4e0;
    }
    std::operator+(&local_470,"Attribute |",&attrName);
    std::operator+(&local_450,&local_470,"| does not exist.");
    std::operator<<((ostream *)&std::cerr,(string *)&local_450);
LAB_00154f7a:
    std::__cxx11::string::~string((string *)&local_450);
    this_02 = &local_470;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ssLine,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   multifaq::config::FEATURE_CONF_abi_cxx11_," does not exist. \n");
    std::operator<<((ostream *)&std::cerr,(string *)&ssLine);
    this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ssLine;
  }
  std::__cxx11::string::~string((string *)this_02);
LAB_00154f91:
  exit(1);
}

Assistant:

void RegressionTree::loadFeatures()
{
    _queryRootIndex = new size_t[NUM_OF_VARIABLES]();

    /* Load the two-pass variables config file into an input stream. */
    ifstream input(FEATURE_CONF);

    if (!input)
    {
        ERROR(FEATURE_CONF+" does not exist. \n");
        exit(1);
    }

    /* String and associated stream to receive lines from the file. */
    string line;
    stringstream ssLine;

    int numOfFeatures = 0;
    int degreeOfInteractions = 0;
    
    /* Ignore comment and empty lines at the top */
    while (getline(input, line))
    {
        if (line[0] == COMMENT_CHAR || line == "")
            continue;
        break;
    }
    
    /* 
     * Extract number of labels, features and interactions from the config. 
     * Parse the line with the three numbers; ignore spaces. 
     */
    bool parsingSuccess =
        qi::phrase_parse(line.begin(), line.end(),

                         /* Begin Boost Spirit grammar. */
                         ((qi::int_[phoenix::ref(numOfFeatures) = qi::_1])
                          >> NUMBER_SEPARATOR_CHAR
                          >> (qi::int_[phoenix::ref(degreeOfInteractions) =
                                       qi::_1])),
                         /*  End grammar. */
                          ascii::space);

    assert(parsingSuccess && "The parsing of the features file has failed.");

    
    /* Ignore comment and empty lines at the top */
    while (getline(input, line))
    {
        if (line[0] == COMMENT_CHAR || line == "")
            continue;

        break;
    }
    
    ssLine << line;


    string labelName;
    /* Extract the name of the attribute in the current line. */
    getline(ssLine, labelName, ATTRIBUTE_NAME_CHAR);

    string typeOfLabel;
    /* Extract the dimension of the current attribute. */
    getline(ssLine, typeOfLabel);

    if (!_classification && stoi(typeOfLabel) != 0)
    {
        ERROR("The label needs to be continuous! ");
        exit(1);
    }
    else if (_classification && stoi(typeOfLabel) != 1)
    {
        ERROR("The label needs to be categorical! ");
        exit(1);
    }
        

    _labelID = _td->getAttributeIndex(labelName);

    /* Clear string stream. */
    ssLine.clear();
    
    /* Read in the features. */
    for (int featureNo = 1; featureNo < numOfFeatures; ++featureNo)
    {
        getline(input, line);
        if (line[0] == COMMENT_CHAR || line == "")
        {
            --featureNo;
            continue;
        }

        ssLine << line;
        
        string attrName;
        /* Extract the name of the attribute in the current line. */
        getline(ssLine, attrName, ATTRIBUTE_NAME_CHAR);

        string typeOfFeature;
        /* Extract the dimension of the current attribute. */
        getline(ssLine, typeOfFeature, ATTRIBUTE_NAME_CHAR);

        string rootName;
        /* Extract the dimension of the current attribute. */
        getline(ssLine, rootName);
        
        int attributeID = _td->getAttributeIndex(attrName);
        bool categorical = stoi(typeOfFeature);
        int rootID = _td->getRelationIndex(rootName);

        if (attributeID == -1)
        {
            ERROR("Attribute |"+attrName+"| does not exist.");
            exit(1);
        }

        if (featureNo == 0 && categorical == 1)
        {
            ERROR("The label needs to be continuous! ");
            exit(1);
        }

        if (rootID == -1)
        {
            ERROR("Relation |"+rootName+"| does not exist.");
            exit(1);
        }

        _features.set(attributeID);

        if (categorical)
            _categoricalFeatures.set(attributeID);

        _queryRootIndex[attributeID] = rootID;
        
        /* Clear string stream. */
        ssLine.clear();
    }

    // cout << _features << "\n";
    // cout << _categoricalFeatures << "\n";
}